

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

__pid_t __thiscall kj::_::NeverDone::wait(NeverDone *this,void *__stat_loc)

{
  SourceLocation location;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<kj::_::Void> dummy;
  OwnPromiseNode local_1c0;
  ExceptionOrValue local_1b8;
  undefined1 local_20;
  
  local_1b8.exception.ptr.isSet = false;
  local_20 = 0;
  neverDone();
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  waitImpl(&local_1c0,&local_1b8,(WaitScope *)__stat_loc,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
  unreachable();
}

Assistant:

void NeverDone::wait(WaitScope& waitScope, SourceLocation location) const {
  ExceptionOr<Void> dummy;
  waitImpl(neverDone(), dummy, waitScope, location);
  KJ_UNREACHABLE;
}